

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

void google::LogDestination::RemoveLogSink(LogSink *destination)

{
  value_type pLVar1;
  vector<google::LogSink_*,_std::allocator<google::LogSink_*>_> *this;
  size_type sVar2;
  reference ppLVar3;
  int local_1c;
  int i;
  MutexLock l;
  LogSink *destination_local;
  
  l.mu_ = (Mutex *)destination;
  ::glog_internal_namespace_::MutexLock::MutexLock
            ((MutexLock *)&stack0xffffffffffffffe8,(Mutex *)sink_mutex_);
  if (sinks_ != (vector<google::LogSink_*,_std::allocator<google::LogSink_*>_> *)0x0) {
    sVar2 = std::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>::size(sinks_);
    local_1c = (int)sVar2;
    do {
      local_1c = local_1c + -1;
      if (local_1c < 0) goto LAB_001275ea;
      ppLVar3 = std::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>::operator[]
                          (sinks_,(long)local_1c);
      this = sinks_;
    } while ((Mutex *)*ppLVar3 != l.mu_);
    sVar2 = std::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>::size(sinks_);
    ppLVar3 = std::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>::operator[]
                        (this,sVar2 - 1);
    pLVar1 = *ppLVar3;
    ppLVar3 = std::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>::operator[]
                        (sinks_,(long)local_1c);
    *ppLVar3 = pLVar1;
    std::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>::pop_back(sinks_);
  }
LAB_001275ea:
  ::glog_internal_namespace_::MutexLock::~MutexLock((MutexLock *)&stack0xffffffffffffffe8);
  return;
}

Assistant:

inline void LogDestination::RemoveLogSink(LogSink *destination) {
  // Prevent any subtle race conditions by wrapping a mutex lock around
  // all this stuff.
  MutexLock l(&sink_mutex_);
  // This doesn't keep the sinks in order, but who cares?
  if (sinks_) {
    for (int i = sinks_->size() - 1; i >= 0; i--) {
      if ((*sinks_)[i] == destination) {
        (*sinks_)[i] = (*sinks_)[sinks_->size() - 1];
        sinks_->pop_back();
        break;
      }
    }
  }
}